

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall dns::Message::encode(Message *this,char *buffer,uint bufferSize,uint *validSize)

{
  bool bVar1;
  uint uVar2;
  iterator this_00;
  uint *in_RCX;
  Buffer *in_RDI;
  iterator it_3;
  iterator it_2;
  iterator it_1;
  iterator it;
  uint fields;
  Buffer buff;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  Buffer *buffer_00;
  ResourceRecord *in_stack_ffffffffffffff60;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_98;
  ResourceRecord **local_90;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_88;
  ResourceRecord **local_80;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_78;
  QuerySection **local_70;
  __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
  local_68;
  int local_60;
  Buffer local_50;
  uint *local_20;
  
  *in_RCX = 0;
  buffer_00 = &local_50;
  local_20 = in_RCX;
  Buffer::Buffer(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
  Buffer::put16bits(in_RDI,in_stack_ffffffffffffff4c);
  local_60 = (*(uint *)((long)&in_RDI->mBuffer + 4) & 1) * 0x8000 +
             (in_RDI->mBufferSize & 0xf) * 0x800 + (*(uint *)&in_RDI->field_0xc & 1) * 0x400 +
             (*(uint *)&in_RDI->mBufferPtr & 1) * 0x200 +
             (*(uint *)((long)&in_RDI->mBufferPtr + 4) & 1) * 0x100 +
             (*(uint *)&(in_RDI->mLinkPos).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start & 1) * 0x80 +
             (*(uint *)((long)&(in_RDI->mLinkPos).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4) & 0xf);
  Buffer::put16bits(in_RDI,in_stack_ffffffffffffff4c);
  std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::size
            ((vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_> *)
             &(in_RDI->mLinkPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  Buffer::put16bits(in_RDI,in_stack_ffffffffffffff4c);
  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
             &in_RDI[1].mBufferSize);
  Buffer::put16bits(in_RDI,in_stack_ffffffffffffff4c);
  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
             &in_RDI[1].mLinkPos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  Buffer::put16bits(in_RDI,in_stack_ffffffffffffff4c);
  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::size
            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
             &in_RDI[2].mBufferSize);
  Buffer::put16bits(in_RDI,in_stack_ffffffffffffff4c);
  local_68._M_current =
       (QuerySection **)
       std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::begin
                 ((vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while( true ) {
    local_70 = (QuerySection **)
               std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::end
                         ((vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_> *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
    ::operator*(&local_68);
    QuerySection::encode
              ((QuerySection *)in_RDI,
               (Buffer *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    __gnu_cxx::
    __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
    ::operator++(&local_68);
  }
  local_78._M_current =
       (ResourceRecord **)
       std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                 ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while( true ) {
    local_80 = (ResourceRecord **)
               std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
                         ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator*(&local_78);
    ResourceRecord::encode(in_stack_ffffffffffffff60,buffer_00);
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator++(&local_78);
  }
  local_88._M_current =
       (ResourceRecord **)
       std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                 ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while( true ) {
    local_90 = (ResourceRecord **)
               std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
                         ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator*(&local_88);
    ResourceRecord::encode(in_stack_ffffffffffffff60,buffer_00);
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator++(&local_88);
  }
  local_98._M_current =
       (ResourceRecord **)
       std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                 ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while( true ) {
    this_00 = std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
                        ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator*(&local_98);
    ResourceRecord::encode((ResourceRecord *)this_00._M_current,buffer_00);
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator++(&local_98);
  }
  uVar2 = Buffer::getPos(&local_50);
  *local_20 = uVar2;
  Buffer::~Buffer((Buffer *)0x118e70);
  return;
}

Assistant:

void Message::encode(char* buffer, const uint bufferSize, uint &validSize)
{
    validSize = 0;
    Buffer buff(buffer, bufferSize);

    // encode header 

    buff.put16bits(mId);
    uint fields = ((mQr & 1) << 15);
    fields += ((mOpCode & 15) << 11);
    fields += ((mAA & 1) << 10);
    fields += ((mTC & 1) << 9);
    fields += ((mRD & 1) << 8);
    fields += ((mRA & 1) << 7);
    fields += ((mRCode & 15));
    buff.put16bits(fields);
    buff.put16bits(mQueries.size());
    buff.put16bits(mAnswers.size());
    buff.put16bits(mAuthorities.size());
    buff.put16bits(mAdditional.size());

    // encode queries
    for(std::vector<QuerySection*>::iterator it = mQueries.begin(); it != mQueries.end(); ++it)
        (*it)->encode(buff);

    // encode answers 
    for(std::vector<ResourceRecord*>::iterator it = mAnswers.begin(); it != mAnswers.end(); ++it)
        (*it)->encode(buff);

    // encode authorities
    for(std::vector<ResourceRecord*>::iterator it = mAuthorities.begin(); it != mAuthorities.end(); ++it)
        (*it)->encode(buff);

    // encode additional 
    for(std::vector<ResourceRecord*>::iterator it = mAdditional.begin(); it != mAdditional.end(); ++it)
        (*it)->encode(buff);

    validSize = buff.getPos();
}